

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

void Mf_ObjMergeOrder(Mf_Man_t *p,int iObj)

{
  int nCutNum_00;
  int iVar1;
  int iVar2;
  int fCompl0;
  int fCompl1;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Gia_Obj_t *pObj_00;
  Mf_Obj_t *pMVar10;
  Gia_Obj_t *pObj_01;
  word wVar11;
  int fIsXor;
  Mf_Cut_t *pCut2Lim_1;
  Mf_Cut_t *pCut2_1;
  int fComp2;
  int nCuts2_1;
  Mf_Cut_t pCuts2_1 [16];
  Mf_Cut_t *pCut2Lim;
  Mf_Cut_t *pCut2;
  int nCuts2;
  int fCompE;
  Gia_Obj_t *pObjE;
  Mf_Cut_t pCuts2 [16];
  int local_cf0;
  int local_cec;
  int nCutsR;
  int i;
  Mf_Cut_t *pCut1Lim;
  Mf_Cut_t *pCut0Lim;
  Mf_Cut_t *pCut1;
  Mf_Cut_t *pCut0;
  int iSibl;
  int fComp1;
  int fComp0;
  int nCuts1;
  int nCuts0;
  int nCutNum;
  int nLutSize;
  Mf_Obj_t *pBest;
  Gia_Obj_t *pObj;
  Mf_Cut_t *pCutsR [16];
  Mf_Cut_t pCuts [16];
  Mf_Cut_t pCuts1 [16];
  Mf_Cut_t pCuts0 [16];
  int iObj_local;
  Mf_Man_t *p_local;
  
  pObj_00 = Gia_ManObj(p->pGia,iObj);
  pMVar10 = Mf_ManObj(p,iObj);
  iVar9 = p->pPars->nLutSize;
  nCutNum_00 = p->pPars->nCutNum;
  iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
  iVar1 = Mf_ManPrepareCuts((Mf_Cut_t *)(pCuts1[0xf].pLeaves + 9),p,iVar1,1);
  iVar2 = Gia_ObjFaninId1(pObj_00,iObj);
  iVar2 = Mf_ManPrepareCuts((Mf_Cut_t *)(pCuts[0xf].pLeaves + 9),p,iVar2,1);
  fCompl0 = Gia_ObjFaninC0(pObj_00);
  fCompl1 = Gia_ObjFaninC1(pObj_00);
  iVar3 = Gia_ObjSibl(p->pGia,iObj);
  local_cf0 = 0;
  for (local_cec = 0; local_cec < nCutNum_00; local_cec = local_cec + 1) {
    pCutsR[(long)local_cec + -1] = (Mf_Cut_t *)(pCuts[(long)local_cec + -1].pLeaves + 9);
  }
  if (iVar3 != 0) {
    pObj_01 = Gia_ObjSiblObj(p->pGia,iObj);
    uVar4 = Gia_ObjPhase(pObj_00);
    uVar5 = Gia_ObjPhase(pObj_01);
    iVar3 = Mf_ManPrepareCuts((Mf_Cut_t *)&pObjE,p,iVar3,0);
    pCuts2_1[0xf].pLeaves._36_8_ = pCuts2[(long)iVar3 + -1].pLeaves + 9;
    for (pCut2Lim = (Mf_Cut_t *)&pObjE; pCut2Lim < (ulong)pCuts2_1[0xf].pLeaves._36_8_;
        pCut2Lim = pCut2Lim + 1) {
      memcpy(pCutsR[(long)local_cf0 + -1],pCut2Lim,0x40);
      uVar6 = Abc_LitNotCond(*(uint *)&pCutsR[(long)local_cf0 + -1]->field_0x10 & 0x7ffffff,
                             uVar4 ^ uVar5);
      *(uint *)&pCutsR[(long)local_cf0 + -1]->field_0x10 =
           *(uint *)&pCutsR[(long)local_cf0 + -1]->field_0x10 & 0xf8000000 | uVar6 & 0x7ffffff;
      Mf_CutParams(p,pCutsR[(long)local_cf0 + -1],pMVar10->nFlowRefs);
      local_cf0 = Mf_SetAddCut((Mf_Cut_t **)&pObj,local_cf0,nCutNum_00);
    }
  }
  iVar3 = Gia_ObjIsMuxId(p->pGia,iObj);
  if (iVar3 == 0) {
    iVar3 = Gia_ObjIsXor(pObj_00);
    p->CutCount[0] = (double)(iVar1 * iVar2) + p->CutCount[0];
    for (pCut1 = (Mf_Cut_t *)(pCuts1[0xf].pLeaves + 9);
        pCut1 < (Mf_Cut_t *)(pCuts1[(long)iVar1 + 0xf].pLeaves + 9); pCut1 = pCut1 + 1) {
      for (pCut0Lim = (Mf_Cut_t *)(pCuts[0xf].pLeaves + 9);
          pCut0Lim < (Mf_Cut_t *)(pCuts[(long)iVar2 + 0xf].pLeaves + 9); pCut0Lim = pCut0Lim + 1) {
        if (((int)((*(uint *)&pCut1->field_0x10 >> 0x1b) + (*(uint *)&pCut0Lim->field_0x10 >> 0x1b))
             <= iVar9) || (iVar7 = Mf_CutCountBits(pCut1->Sign | pCut0Lim->Sign), iVar7 <= iVar9)) {
          p->CutCount[1] = p->CutCount[1] + 1.0;
          iVar7 = Mf_CutMergeOrder(pCut1,pCut0Lim,pCutsR[(long)local_cf0 + -1],iVar9);
          if ((iVar7 != 0) &&
             (iVar7 = Mf_SetLastCutIsContained((Mf_Cut_t **)&pObj,local_cf0), iVar7 == 0)) {
            p->CutCount[2] = p->CutCount[2] + 1.0;
            if ((p->pPars->fCutMin != 0) &&
               (iVar7 = Mf_CutComputeTruth(p,pCut1,pCut0Lim,fCompl0,fCompl1,
                                           pCutsR[(long)local_cf0 + -1],iVar3), iVar7 != 0)) {
              wVar11 = Mf_CutGetSign(pCutsR[(long)local_cf0 + -1]->pLeaves,
                                     *(uint *)&pCutsR[(long)local_cf0 + -1]->field_0x10 >> 0x1b);
              pCutsR[(long)local_cf0 + -1]->Sign = wVar11;
            }
            Mf_CutParams(p,pCutsR[(long)local_cf0 + -1],pMVar10->nFlowRefs);
            local_cf0 = Mf_SetAddCut((Mf_Cut_t **)&pObj,local_cf0,nCutNum_00);
          }
        }
      }
    }
  }
  else {
    iVar3 = Gia_ObjFaninId2(p->pGia,iObj);
    iVar3 = Mf_ManPrepareCuts((Mf_Cut_t *)&fComp2,p,iVar3,1);
    iVar7 = Gia_ObjFaninC2(p->pGia,pObj_00);
    p->CutCount[0] = (double)(iVar1 * iVar2 * iVar3) + p->CutCount[0];
    for (pCut1 = (Mf_Cut_t *)(pCuts1[0xf].pLeaves + 9);
        pCut1 < (Mf_Cut_t *)(pCuts1[(long)iVar1 + 0xf].pLeaves + 9); pCut1 = pCut1 + 1) {
      for (pCut0Lim = (Mf_Cut_t *)(pCuts[0xf].pLeaves + 9);
          pCut0Lim < (Mf_Cut_t *)(pCuts[(long)iVar2 + 0xf].pLeaves + 9); pCut0Lim = pCut0Lim + 1) {
        for (pCut2Lim_1 = (Mf_Cut_t *)&fComp2;
            pCut2Lim_1 < (Mf_Cut_t *)(&fComp2 + (long)iVar3 * 0x10); pCut2Lim_1 = pCut2Lim_1 + 1) {
          iVar8 = Mf_CutCountBits(pCut1->Sign | pCut0Lim->Sign | pCut2Lim_1->Sign);
          if (iVar8 <= iVar9) {
            p->CutCount[1] = p->CutCount[1] + 1.0;
            iVar8 = Mf_CutMergeOrderMux(pCut1,pCut0Lim,pCut2Lim_1,pCutsR[(long)local_cf0 + -1],iVar9
                                       );
            if ((iVar8 != 0) &&
               (iVar8 = Mf_SetLastCutIsContained((Mf_Cut_t **)&pObj,local_cf0), iVar8 == 0)) {
              p->CutCount[2] = p->CutCount[2] + 1.0;
              if ((p->pPars->fCutMin != 0) &&
                 (iVar8 = Mf_CutComputeTruthMux
                                    (p,pCut1,pCut0Lim,pCut2Lim_1,fCompl0,fCompl1,iVar7,
                                     pCutsR[(long)local_cf0 + -1]), iVar8 != 0)) {
                wVar11 = Mf_CutGetSign(pCutsR[(long)local_cf0 + -1]->pLeaves,
                                       *(uint *)&pCutsR[(long)local_cf0 + -1]->field_0x10 >> 0x1b);
                pCutsR[(long)local_cf0 + -1]->Sign = wVar11;
              }
              Mf_CutParams(p,pCutsR[(long)local_cf0 + -1],pMVar10->nFlowRefs);
              local_cf0 = Mf_SetAddCut((Mf_Cut_t **)&pObj,local_cf0,nCutNum_00);
            }
          }
        }
      }
    }
  }
  pMVar10->Flow = *(float *)(pObj + 1);
  *(uint *)&pMVar10->field_0xc = *(uint *)&pMVar10->field_0xc & 0xffff0000 | pObj->Value & 0xffff;
  iVar9 = Mf_ManSaveCuts(p,(Mf_Cut_t **)&pObj,local_cf0);
  pMVar10->iCutSet = iVar9;
  if ((0 < local_cf0) && (local_cf0 < nCutNum_00)) {
    uVar4 = *(uint *)&pObj[1].field_0x4 >> 0x1b;
    p->nCutCounts[uVar4] = p->nCutCounts[uVar4] + 1;
    p->CutCount[3] = (double)local_cf0 + p->CutCount[3];
    return;
  }
  __assert_fail("nCutsR > 0 && nCutsR < nCutNum",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                ,0x45c,"void Mf_ObjMergeOrder(Mf_Man_t *, int)");
}

Assistant:

void Mf_ObjMergeOrder( Mf_Man_t * p, int iObj )
{
    Mf_Cut_t pCuts0[MF_CUT_MAX], pCuts1[MF_CUT_MAX], pCuts[MF_CUT_MAX], * pCutsR[MF_CUT_MAX];
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    Mf_Obj_t * pBest = Mf_ManObj(p, iObj);
    int nLutSize = p->pPars->nLutSize;
    int nCutNum  = p->pPars->nCutNum;
    int nCuts0   = Mf_ManPrepareCuts(pCuts0, p, Gia_ObjFaninId0(pObj, iObj), 1);
    int nCuts1   = Mf_ManPrepareCuts(pCuts1, p, Gia_ObjFaninId1(pObj, iObj), 1);
    int fComp0   = Gia_ObjFaninC0(pObj);
    int fComp1   = Gia_ObjFaninC1(pObj);
    int iSibl    = Gia_ObjSibl(p->pGia, iObj);
    Mf_Cut_t * pCut0, * pCut1, * pCut0Lim = pCuts0 + nCuts0, * pCut1Lim = pCuts1 + nCuts1;
    int i, nCutsR = 0;
    for ( i = 0; i < nCutNum; i++ )
        pCutsR[i] = pCuts + i;
    if ( iSibl )
    {
        Mf_Cut_t pCuts2[MF_CUT_MAX];
        Gia_Obj_t * pObjE = Gia_ObjSiblObj(p->pGia, iObj);
        int fCompE = Gia_ObjPhase(pObj) ^ Gia_ObjPhase(pObjE);
        int nCuts2 = Mf_ManPrepareCuts(pCuts2, p, iSibl, 0);
        Mf_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            *pCutsR[nCutsR] = *pCut2;
            if ( pCutsR[nCutsR]->iFunc >= 0 )
                pCutsR[nCutsR]->iFunc = Abc_LitNotCond( pCutsR[nCutsR]->iFunc, fCompE );
            Mf_CutParams( p, pCutsR[nCutsR], pBest->nFlowRefs );
            nCutsR = Mf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    if ( Gia_ObjIsMuxId(p->pGia, iObj) )
    {
        Mf_Cut_t pCuts2[MF_CUT_MAX];
        int nCuts2  = Mf_ManPrepareCuts(pCuts2, p, Gia_ObjFaninId2(p->pGia, iObj), 1);
        int fComp2  = Gia_ObjFaninC2(p->pGia, pObj);
        Mf_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        p->CutCount[0] += nCuts0 * nCuts1 * nCuts2;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            if ( Mf_CutCountBits(pCut0->Sign | pCut1->Sign | pCut2->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Mf_CutMergeOrderMux(pCut0, pCut1, pCut2, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Mf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Mf_CutComputeTruthMux(p, pCut0, pCut1, pCut2, fComp0, fComp1, fComp2, pCutsR[nCutsR]) )
                pCutsR[nCutsR]->Sign = Mf_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Mf_CutParams( p, pCutsR[nCutsR], pBest->nFlowRefs );
            nCutsR = Mf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    else
    {
        int fIsXor = Gia_ObjIsXor(pObj);
        p->CutCount[0] += nCuts0 * nCuts1;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        {
            if ( (int)(pCut0->nLeaves + pCut1->nLeaves) > nLutSize && Mf_CutCountBits(pCut0->Sign | pCut1->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Mf_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Mf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Mf_CutComputeTruth(p, pCut0, pCut1, fComp0, fComp1, pCutsR[nCutsR], fIsXor) )
                pCutsR[nCutsR]->Sign = Mf_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Mf_CutParams( p, pCutsR[nCutsR], pBest->nFlowRefs );
            nCutsR = Mf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    // debug printout
    if ( 0 )
//    if ( iObj % 1000 == 0 )
//    if ( iObj == 474 )
    {
        printf( "*** Obj = %d  FlowRefs = %.2f  MapRefs = %2d\n", iObj, pBest->nFlowRefs, pBest->nMapRefs );
        for ( i = 0; i < nCutsR; i++ )
            Mf_CutPrint( p, pCutsR[i] );
        printf( "\n" );
    } 
    // store the cutset
    pBest->Flow = pCutsR[0]->Flow;
    pBest->Delay = pCutsR[0]->Delay;
    pBest->iCutSet = Mf_ManSaveCuts( p, pCutsR, nCutsR );
    // verify
    assert( nCutsR > 0 && nCutsR < nCutNum );
//    assert( Mf_SetCheckArray(pCutsR, nCutsR) );
    p->nCutCounts[pCutsR[0]->nLeaves]++;
    p->CutCount[3] += nCutsR;
}